

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_XPM_Image.cxx
# Opt level: O2

int hexdigit(int x)

{
  int iVar1;
  uint uVar2;
  
  uVar2 = x - 0x30U;
  if (9 < x - 0x30U) {
    iVar1 = isupper(x);
    if (iVar1 == 0) {
      iVar1 = islower(x);
      uVar2 = 0x14;
      if (iVar1 != 0) {
        uVar2 = x - 0x57;
      }
    }
    else {
      uVar2 = x - 0x37;
    }
  }
  return uVar2;
}

Assistant:

static int hexdigit(int x) {	// I - Hex digit...
  if (isdigit(x)) return x-'0';
  if (isupper(x)) return x-'A'+10;
  if (islower(x)) return x-'a'+10;
  return 20;
}